

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide::~Provide
          (Provide *this)

{
  Entry *pEVar1;
  Disposer *pDVar2;
  int iVar3;
  char (*in_RCX) [117];
  Entry *pEVar4;
  Array<char> local_1d8;
  Exception local_1c0;
  
  pEVar1 = (this->embargoes).table.rows.builder.pos;
  for (pEVar4 = (this->embargoes).table.rows.builder.ptr; pEVar4 != pEVar1;
      pEVar4 = (Entry *)&pEVar4[1].value.ptr) {
    iVar3 = (*(pEVar4[1].value.disposer)->_vptr_Disposer[1])();
    if ((char)iVar3 != '\0') {
      pDVar2 = pEVar4[1].value.disposer;
      kj::_::Debug::makeDescription<char_const(&)[117]>
                ((String *)&local_1d8,
                 (Debug *)
                 "\"Three-party handoff failed because a connection was lost along the introducing \" \"route before the embargo could clear.\""
                 ,
                 "Three-party handoff failed because a connection was lost along the introducing route before the embargo could clear."
                 ,in_RCX);
      in_RCX = (char (*) [117])0x1106;
      kj::Exception::Exception
                (&local_1c0,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x1106,(String *)&local_1d8);
      (**pDVar2->_vptr_Disposer)(pDVar2,&local_1c0);
      kj::Exception::~Exception(&local_1c0);
      kj::Array<char>::~Array(&local_1d8);
    }
  }
  kj::
  Table<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,_kj::HashIndex<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>_>
  ::~Table((Table<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,_kj::HashIndex<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>_>
            *)&this->embargoes);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&this->client);
  return;
}

Assistant:

~Provide() noexcept(false) {
        for (auto& e: embargoes) {
          if (e.value.fulfiller->isWaiting()) {
            e.value.fulfiller->reject(KJ_EXCEPTION(DISCONNECTED,
                "Three-party handoff failed because a connection was lost along the introducing "
                "route before the embargo could clear."));
          }
        }
      }